

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

void convert_expr_top(iasctx *ctx,easm_expr *expr)

{
  int iVar1;
  litem *plVar2;
  litem *plVar3;
  litem **pplVar4;
  litem *li;
  litem *see;
  litem *ses;
  easm_expr *expr_local;
  iasctx *ctx_local;
  
  if (expr->type == EASM_EXPR_SINSN) {
    plVar2 = (litem *)calloc(0x20,1);
    plVar3 = (litem *)calloc(0x20,1);
    plVar2->type = LITEM_SESTART;
    plVar3->type = LITEM_SEEND;
    if (ctx->atomsmax <= ctx->atomsnum) {
      if (ctx->atomsmax == 0) {
        ctx->atomsmax = 0x10;
      }
      else {
        ctx->atomsmax = ctx->atomsmax << 1;
      }
      pplVar4 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
      ctx->atoms = pplVar4;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = plVar2;
    convert_sinsn(ctx,expr->sinsn);
    if (ctx->atomsmax <= ctx->atomsnum) {
      if (ctx->atomsmax == 0) {
        ctx->atomsmax = 0x10;
      }
      else {
        ctx->atomsmax = ctx->atomsmax << 1;
      }
      pplVar4 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
      ctx->atoms = pplVar4;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = plVar3;
  }
  else {
    plVar2 = (litem *)calloc(0x20,1);
    plVar2->type = LITEM_EXPR;
    plVar2->expr = expr;
    if (ctx->atomsmax <= ctx->atomsnum) {
      if (ctx->atomsmax == 0) {
        ctx->atomsmax = 0x10;
      }
      else {
        ctx->atomsmax = ctx->atomsmax << 1;
      }
      pplVar4 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
      ctx->atoms = pplVar4;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = plVar2;
  }
  return;
}

Assistant:

void convert_expr_top(struct iasctx *ctx, struct easm_expr *expr) {
	if (expr->type == EASM_EXPR_SINSN) {
		struct litem *ses = calloc(sizeof *ses, 1);
		struct litem *see = calloc(sizeof *see, 1);
		ses->type = LITEM_SESTART;
		see->type = LITEM_SEEND;
		ADDARRAY(ctx->atoms, ses);
		convert_sinsn(ctx, expr->sinsn);
		ADDARRAY(ctx->atoms, see);
	} else {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_EXPR;
		li->expr = expr;
		ADDARRAY(ctx->atoms, li);
	}
}